

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpnghandler.cpp
# Opt level: O0

void __thiscall QPngHandler::setOption(QPngHandler *this,ImageOption option,QVariant *value)

{
  long lVar1;
  bool *in_RDX;
  int in_ESI;
  QString *in_RDI;
  long in_FS_OFFSET;
  undefined4 uVar2;
  QString *in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 6) {
    uVar2 = ::QVariant::toFloat(in_RDX);
    *(undefined4 *)(in_RDI->d).size = uVar2;
  }
  else if (in_ESI == 7) {
    uVar2 = ::QVariant::toInt(in_RDX);
    *(undefined4 *)((in_RDI->d).size + 8) = uVar2;
  }
  else if (in_ESI == 5) {
    uVar2 = ::QVariant::toInt(in_RDX);
    *(undefined4 *)((in_RDI->d).size + 0xc) = uVar2;
  }
  else if (in_ESI == 2) {
    ::QVariant::toString();
    QString::operator=(in_RDI,in_stack_ffffffffffffffb8);
    QString::~QString((QString *)0x9aca06);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPngHandler::setOption(ImageOption option, const QVariant &value)
{
    if (option == Gamma)
        d->gamma = value.toFloat();
    else if (option == Quality)
        d->quality = value.toInt();
    else if (option == CompressionRatio)
        d->compression = value.toInt();
    else if (option == Description)
        d->description = value.toString();
}